

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall gulps::gulps_output::add_filter(gulps_output *this,filter_fun filter)

{
  filter_fun local_8;
  
  local_8 = filter;
  std::vector<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>::
  push_back(&this->filters,&local_8);
  return;
}

Assistant:

void add_filter(filter_fun filter) { filters.push_back(filter); }